

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O3

void __thiscall MIDIplay::applySetup(MIDIplay *this)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  OPL3 *this_00;
  byte bVar5;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar6;
  byte bVar7;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar9;
  ADLMIDI_VolumeModels volumeModel;
  ulong uVar10;
  value_type local_80;
  byte bVar8;
  
  this_00 = (this->m_synth).m_p;
  this_00->m_musicMode = MODE_MIDI;
  (this->m_setup).tick_skip_samples_delay = 0;
  this_00->m_runAtPcmRate = (this->m_setup).runAtPcmRate;
  if (this_00->m_embeddedBank == 0xffffffff) {
    bVar7 = (this_00->m_insBankSetup).deepTremolo;
    bVar5 = (this_00->m_insBankSetup).deepVibrato;
  }
  else {
    uVar1 = g_embeddedBanks[(this->m_setup).bankId].bankSetup;
    (this_00->m_insBankSetup).volumeModel = uVar1 & 0xff;
    bVar8 = (byte)(uVar1 >> 8);
    bVar7 = bVar8 & 1;
    (this_00->m_insBankSetup).deepTremolo = (bool)bVar7;
    bVar5 = bVar8 >> 1 & 1;
    (this_00->m_insBankSetup).deepVibrato = (bool)bVar5;
    (this_00->m_insBankSetup).mt32defaults = (bool)(bVar8 >> 2 & 1);
  }
  iVar2 = (this->m_setup).deepTremoloMode;
  bVar8 = iVar2 != 0;
  if (iVar2 < 0) {
    bVar8 = bVar7;
  }
  this_00->m_deepTremoloMode = (bool)(bVar8 & 1);
  iVar2 = (this->m_setup).deepVibratoMode;
  bVar7 = iVar2 != 0;
  if (iVar2 < 0) {
    bVar7 = bVar5;
  }
  this_00->m_deepVibratoMode = (bool)(bVar7 & 1);
  iVar2 = (this->m_setup).scaleModulators;
  bVar7 = iVar2 != 0;
  if (iVar2 < 0) {
    bVar7 = (this_00->m_insBankSetup).scaleModulators;
  }
  this_00->m_scaleModulators = (bool)(bVar7 & 1);
  volumeModel = ADLMIDI_VolumeModel_CMF;
  if ((this->m_setup).logarithmicVolumes == false) {
    volumeModel = (this->m_setup).volumeScaleModel;
  }
  ::OPL3::setVolumeScaleModel(this_00,volumeModel);
  if ((this->m_setup).volumeScaleModel == 0) {
    this_00->m_volumeScale = (this_00->m_insBankSetup).volumeModel;
  }
  this_00->m_numChips = (this->m_setup).numChips;
  this->m_cmfPercussionMode = false;
  uVar3 = (this->m_setup).numFourOps;
  if ((int)uVar3 < 0) {
    adlCalculateFourOpChannels(this,true);
  }
  else {
    this_00->m_numFourOps = uVar3;
  }
  ::OPL3::reset((this->m_synth).m_p,(this->m_setup).emulator,(this->m_setup).PCM_RATE,this);
  std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::_M_erase_at_end
            (&this->m_chipChannels,
             (this->m_chipChannels).
             super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>._M_impl
             .super__Vector_impl_data._M_start);
  uVar4 = this_00->m_numChannels;
  uVar10 = 0;
  local_80.koff_time_until_neglible_us = 0;
  local_80.users.cells_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)operator_new__(0x2000);
  local_80.users.cells_allocd_ = true;
  local_80.users.capacity_ = 0x80;
  local_80.users.size_ = 0;
  local_80.users.endcell_.prev = (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0;
  local_80.users.endcell_.next = (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0;
  ppVar6 = local_80.users.cells_;
  do {
    ppVar9 = ppVar6 + -1;
    if (uVar10 == 0) {
      ppVar9 = (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0;
    }
    (ppVar6->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).prev = ppVar9;
    ppVar9 = (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0;
    if (uVar10 < 0x7f) {
      ppVar9 = ppVar6 + 1;
    }
    uVar10 = uVar10 + 1;
    (ppVar6->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next = ppVar9;
    (ppVar6->value).loc.MidCh = 0;
    (ppVar6->value).loc.note = '\0';
    (ppVar6->value).loc.field_0x3 = 0;
    (ppVar6->value).sustained = 0;
    (ppVar6->value)._padding[0] = '\0';
    (ppVar6->value)._padding[1] = '\0';
    (ppVar6->value)._padding[2] = '\0';
    (ppVar6->value)._padding[3] = '\0';
    (ppVar6->value)._padding[4] = '\0';
    (ppVar6->value)._padding[5] = '\0';
    (ppVar6->value).ins.chip_chan = 0;
    (ppVar6->value).ins.op.modulator_E862 = 0;
    (ppVar6->value).ins.op.carrier_E862 = 0;
    *(undefined8 *)&(ppVar6->value).ins.op.modulator_40 = 0;
    (ppVar6->value).kon_time_until_neglible_us = 0;
    (ppVar6->value).vibdelay_us = 0;
    ppVar6 = ppVar6 + 1;
  } while (uVar10 != 0x80);
  local_80.recent_ins._0_8_ = 0;
  local_80.recent_ins._8_8_ = 0;
  local_80.users.first_ = (pl_cell<MIDIplay::AdlChannel::LocationData> *)&local_80.users.endcell_;
  local_80.users.free_ = local_80.users.cells_;
  std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::resize
            (&this->m_chipChannels,(ulong)uVar4,&local_80);
  if ((local_80.users.cells_allocd_ == true) &&
     (local_80.users.cells_ != (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0)) {
    operator_delete__(local_80.users.cells_);
  }
  this->m_arpeggioCounter = 0;
  return;
}

Assistant:

void MIDIplay::applySetup()
{
    Synth &synth = *m_synth;

    synth.m_musicMode = Synth::MODE_MIDI;
    m_setup.tick_skip_samples_delay = 0;
    synth.m_runAtPcmRate = m_setup.runAtPcmRate;

#ifndef DISABLE_EMBEDDED_BANKS
    if(synth.m_embeddedBank != Synth::CustomBankTag)
    {
        const BanksDump::BankEntry &b = g_embeddedBanks[m_setup.bankId];
        synth.m_insBankSetup.volumeModel = (b.bankSetup & 0x00FF);
        synth.m_insBankSetup.deepTremolo = (b.bankSetup >> 8 & 0x0001) != 0;
        synth.m_insBankSetup.deepVibrato = (b.bankSetup >> 8 & 0x0002) != 0;
        synth.m_insBankSetup.mt32defaults = (b.bankSetup >> 8 & 0x0004) != 0;
    }
#endif

    synth.m_deepTremoloMode = m_setup.deepTremoloMode < 0 ?
                              synth.m_insBankSetup.deepTremolo :
                              (m_setup.deepTremoloMode != 0);
    synth.m_deepVibratoMode = m_setup.deepVibratoMode < 0 ?
                              synth.m_insBankSetup.deepVibrato :
                              (m_setup.deepVibratoMode != 0);
    synth.m_scaleModulators = m_setup.scaleModulators < 0 ?
                              synth.m_insBankSetup.scaleModulators :
                              (m_setup.scaleModulators != 0);

    if(m_setup.logarithmicVolumes)
        synth.setVolumeScaleModel(ADLMIDI_VolumeModel_NativeOPL3);
    else
        synth.setVolumeScaleModel(static_cast<ADLMIDI_VolumeModels>(m_setup.volumeScaleModel));

    if(m_setup.volumeScaleModel == ADLMIDI_VolumeModel_AUTO)//Use bank default volume model
        synth.m_volumeScale = (Synth::VolumesScale)synth.m_insBankSetup.volumeModel;

    synth.m_numChips    = m_setup.numChips;
    m_cmfPercussionMode = false;

    if(m_setup.numFourOps >= 0)
        synth.m_numFourOps  = m_setup.numFourOps;
    else
        adlCalculateFourOpChannels(this, true);

    chipReset();
    m_chipChannels.clear();
    m_chipChannels.resize(synth.m_numChannels);

    // Reset the arpeggio counter
    m_arpeggioCounter = 0;
}